

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_disk_posix.c
# Opt level: O0

fixup_entry * sort_dir_list(fixup_entry *p)

{
  int iVar1;
  fixup_entry *pfVar2;
  fixup_entry *in_RDI;
  fixup_entry *t;
  fixup_entry *b;
  fixup_entry *a;
  fixup_entry *local_28;
  fixup_entry *local_20;
  fixup_entry *pfVar3;
  fixup_entry *local_10;
  fixup_entry *local_8;
  
  if (in_RDI == (fixup_entry *)0x0) {
    local_8 = (fixup_entry *)0x0;
  }
  else {
    local_8 = in_RDI;
    if (in_RDI->next != (fixup_entry *)0x0) {
      pfVar2 = in_RDI->next->next;
      local_28 = in_RDI;
      while (pfVar2 != (fixup_entry *)0x0) {
        pfVar2 = pfVar2->next;
        if (pfVar2 != (fixup_entry *)0x0) {
          pfVar2 = pfVar2->next;
        }
        local_28 = local_28->next;
      }
      local_28->next = (fixup_entry *)0x0;
      pfVar2 = sort_dir_list(in_RDI);
      local_10 = sort_dir_list(pfVar2);
      iVar1 = strcmp(pfVar2->name,local_10->name);
      if (iVar1 < 1) {
        local_20 = local_10->next;
        local_28 = local_10;
        pfVar3 = pfVar2;
      }
      else {
        local_28 = pfVar2;
        local_20 = local_10;
        pfVar3 = pfVar2->next;
        local_10 = pfVar2;
      }
      while (pfVar3 != (fixup_entry *)0x0 && local_20 != (fixup_entry *)0x0) {
        iVar1 = strcmp(pfVar3->name,local_20->name);
        if (iVar1 < 1) {
          local_28->next = local_20;
          local_20 = local_20->next;
        }
        else {
          local_28->next = pfVar3;
          pfVar3 = pfVar3->next;
        }
        local_28 = local_28->next;
      }
      if (pfVar3 != (fixup_entry *)0x0) {
        local_28->next = pfVar3;
      }
      if (local_20 != (fixup_entry *)0x0) {
        local_28->next = local_20;
      }
      local_8 = local_10;
    }
  }
  return local_8;
}

Assistant:

static struct fixup_entry *
sort_dir_list(struct fixup_entry *p)
{
	struct fixup_entry *a, *b, *t;

	if (p == NULL)
		return (NULL);
	/* A one-item list is already sorted. */
	if (p->next == NULL)
		return (p);

	/* Step 1: split the list. */
	t = p;
	a = p->next->next;
	while (a != NULL) {
		/* Step a twice, t once. */
		a = a->next;
		if (a != NULL)
			a = a->next;
		t = t->next;
	}
	/* Now, t is at the mid-point, so break the list here. */
	b = t->next;
	t->next = NULL;
	a = p;

	/* Step 2: Recursively sort the two sub-lists. */
	a = sort_dir_list(a);
	b = sort_dir_list(b);

	/* Step 3: Merge the returned lists. */
	/* Pick the first element for the merged list. */
	if (strcmp(a->name, b->name) > 0) {
		t = p = a;
		a = a->next;
	} else {
		t = p = b;
		b = b->next;
	}

	/* Always put the later element on the list first. */
	while (a != NULL && b != NULL) {
		if (strcmp(a->name, b->name) > 0) {
			t->next = a;
			a = a->next;
		} else {
			t->next = b;
			b = b->next;
		}
		t = t->next;
	}

	/* Only one list is non-empty, so just splice it on. */
	if (a != NULL)
		t->next = a;
	if (b != NULL)
		t->next = b;

	return (p);
}